

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_safe_frame.cpp
# Opt level: O0

double __thiscall ON_SafeFrame::ActionFrameXScale(ON_SafeFrame *this)

{
  CImpl *this_00;
  double dVar1;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  ON_SafeFrame *local_10;
  ON_SafeFrame *this_local;
  
  this_00 = this->m_impl;
  local_10 = this;
  ::ON_XMLVariant::ON_XMLVariant(&local_200,0.9);
  CImpl::GetFrameParameter(&local_108,this_00,L"action-frame",L"x-scale",&local_200);
  dVar1 = ::ON_XMLVariant::AsDouble(&local_108);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  return dVar1;
}

Assistant:

double ON_SafeFrame::ActionFrameXScale(void) const
{
  return m_impl->GetFrameParameter(ON_RDK_SF_ACTION_FRAME, ON_RDK_SFF_XSCALE, 0.9).AsDouble();
}